

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

PortConnectionSyntax * __thiscall slang::parsing::Parser::parsePortConnection(Parser *this)

{
  bool bVar1;
  EmptyPortConnectionSyntax *pEVar2;
  WildcardPortConnectionSyntax *pWVar3;
  OrderedPortConnectionSyntax *pOVar4;
  PropertyExprSyntax *pPVar5;
  NamedPortConnectionSyntax *pNVar6;
  size_type sVar7;
  AttrList AVar8;
  Token TVar9;
  Token name;
  Token local_80;
  Token local_70;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  AVar8 = parseAttributes(this);
  sVar7 = AVar8.size_;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  local_60.super_SyntaxListBase.childCount = sVar7;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar8;
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis), bVar1)) {
    local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
    TVar9 = ParserBase::placeholderToken(&this->super_ParserBase);
    pEVar2 = slang::syntax::SyntaxFactory::emptyPortConnection(&this->factory,&local_60,TVar9);
    return &pEVar2->super_PortConnectionSyntax;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,DotStar);
  if (bVar1) {
    local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
    TVar9 = ParserBase::consume(&this->super_ParserBase);
    pWVar3 = slang::syntax::SyntaxFactory::wildcardPortConnection(&this->factory,&local_60,TVar9);
    return &pWVar3->super_PortConnectionSyntax;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
  if (bVar1) {
    TVar9 = ParserBase::consume(&this->super_ParserBase);
    name = ParserBase::expect(&this->super_ParserBase,Identifier);
    Token::Token(&local_70);
    Token::Token(&local_80);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      local_70 = ParserBase::consume(&this->super_ParserBase);
      bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
      if (bVar1) {
        pPVar5 = (PropertyExprSyntax *)0x0;
      }
      else {
        pPVar5 = parsePropertyExpr(this,0);
      }
      local_80 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      pPVar5 = (PropertyExprSyntax *)0x0;
    }
    local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
    pNVar6 = slang::syntax::SyntaxFactory::namedPortConnection
                       (&this->factory,&local_60,TVar9,name,local_70,pPVar5,local_80);
    return &pNVar6->super_PortConnectionSyntax;
  }
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
  pPVar5 = parsePropertyExpr(this,0);
  pOVar4 = slang::syntax::SyntaxFactory::orderedPortConnection(&this->factory,&local_60,pPVar5);
  return &pOVar4->super_PortConnectionSyntax;
}

Assistant:

PortConnectionSyntax& Parser::parsePortConnection() {
    auto attributes = parseAttributes();

    // Allow for empty port connections.
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyPortConnection(attributes, placeholderToken());

    if (peek(TokenKind::DotStar))
        return factory.wildcardPortConnection(attributes, consume());

    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        PropertyExprSyntax* expr = nullptr;
        Token openParen, closeParen;

        if (peek(TokenKind::OpenParenthesis)) {
            openParen = consume();
            if (!peek(TokenKind::CloseParenthesis))
                expr = &parsePropertyExpr(0);

            closeParen = expect(TokenKind::CloseParenthesis);
        }
        return factory.namedPortConnection(attributes, dot, name, openParen, expr, closeParen);
    }
    return factory.orderedPortConnection(attributes, parsePropertyExpr(0));
}